

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void __thiscall SFFile::SetAllOrders(SFFile *this,int order)

{
  uint uVar1;
  SFPerc *pSVar2;
  long lVar3;
  int i;
  long lVar4;
  
  lVar3 = 0x15;
  for (lVar4 = 0; lVar4 < this->NumPresets; lVar4 = lVar4 + 1) {
    this->Presets->Name[lVar3] = this->Presets->Name[lVar3] & 0x80U | (byte)order & 0x7f;
    lVar3 = lVar3 + 0x1c;
  }
  uVar1 = (this->Percussion).Count;
  pSVar2 = (this->Percussion).Array;
  for (lVar3 = 0; (ulong)uVar1 * 0x70 - lVar3 != 0; lVar3 = lVar3 + 0x70) {
    (&pSVar2->LoadOrder)[lVar3] = (byte)order;
  }
  return;
}

Assistant:

void SFFile::SetAllOrders(int order)
{
	for (int i = 0; i < NumPresets; ++i)
	{
		Presets[i].LoadOrder = order;
	}
	for (unsigned int i = 0; i < Percussion.Size(); ++i)
	{
		Percussion[i].LoadOrder = order;
	}
}